

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

void __thiscall
FOptionMenuScreenResolutionLine::FOptionMenuScreenResolutionLine
          (FOptionMenuScreenResolutionLine *this,char *action)

{
  FString *local_38;
  FName local_1c;
  char *local_18;
  char *action_local;
  FOptionMenuScreenResolutionLine *this_local;
  
  local_18 = action;
  action_local = (char *)this;
  FName::FName(&local_1c,action);
  FOptionMenuItem::FOptionMenuItem(&this->super_FOptionMenuItem,"",&local_1c,false);
  (this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FOptionMenuScreenResolutionLine_009ee250;
  local_38 = this->mResTexts;
  do {
    FString::FString(local_38);
    local_38 = local_38 + 1;
  } while (local_38 != (FString *)&this->mSelection);
  this->mSelection = 0;
  this->mHighlight = -1;
  return;
}

Assistant:

FOptionMenuScreenResolutionLine(const char *action)
		: FOptionMenuItem("", action)
	{
		mSelection = 0;
		mHighlight = -1;
	}